

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isVirtualInterfaceOrArray(Type *this)

{
  SymbolKind SVar1;
  bool bVar2;
  Type *this_00;
  Type *in_RDI;
  Type *ct;
  Type *in_stack_fffffffffffffff0;
  
  for (this_00 = getCanonicalType(in_stack_fffffffffffffff0);
      (SVar1 = (this_00->super_Symbol).kind, SVar1 - FixedSizeUnpackedArrayType < 2 ||
      (SVar1 == QueueType)); this_00 = getCanonicalType(this_00)) {
    getArrayElementType(in_RDI);
  }
  bVar2 = isVirtualInterface((Type *)0x10f225b);
  return bVar2;
}

Assistant:

bool Type::isVirtualInterfaceOrArray() const {
    auto ct = &getCanonicalType();
    while (true) {
        switch (ct->kind) {
            case SymbolKind::FixedSizeUnpackedArrayType:
            case SymbolKind::DynamicArrayType:
            case SymbolKind::QueueType:
                ct = &ct->getArrayElementType()->getCanonicalType();
                break;
            default:
                return ct->isVirtualInterface();
        }
    }
}